

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::ElementsDecodeRawTransaction
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct(cfd::js::api::ElementsDecodeRawTransactionRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct(&)(cfd::js::api::ElementsDecodeRawTransactionRequestStruct_const&),void>
            ((function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct(cfd::js::api::ElementsDecodeRawTransactionRequestStruct_const&)>
              *)&local_38,ElementsTransactionStructApi::DecodeRawTransaction);
  ExecuteJsonApi<cfd::js::api::json::ElementsDecodeRawTransactionRequest,cfd::js::api::json::ElementsDecodeRawTransactionResponse,cfd::js::api::ElementsDecodeRawTransactionRequestStruct,cfd::js::api::ElementsDecodeRawTransactionResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::ElementsDecodeRawTransaction(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::ElementsDecodeRawTransactionRequest,
      api::json::ElementsDecodeRawTransactionResponse,
      api::ElementsDecodeRawTransactionRequestStruct,
      api::ElementsDecodeRawTransactionResponseStruct>(
      request_message, ElementsTransactionStructApi::DecodeRawTransaction);
}